

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O2

void __thiscall
wallet::DescriptorScriptPubKeyMan::SetCache(DescriptorScriptPubKeyMan *this,DescriptorCache *cache)

{
  ScriptPubKeyMap *this_00;
  key_type *__x;
  DescriptorCache *this_01;
  _Rb_tree_header *p_Var1;
  long lVar2;
  element_type *peVar3;
  WalletStorage *pWVar4;
  pointer pCVar5;
  int iVar6;
  size_type sVar7;
  uint *puVar8;
  size_type sVar9;
  _Base_ptr p_Var10;
  runtime_error *prVar11;
  mapped_type_conflict3 *args;
  FlatSigningProvider *args_1;
  pointer __x_00;
  uint uVar12;
  long in_FS_OFFSET;
  vector<CScript,_std::allocator<CScript>_> scripts_temp;
  uint local_194;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock72;
  string local_180;
  FlatSigningProvider out_keys;
  set<CScript,_std::less<CScript>,_std::allocator<CScript>_> new_spks;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock72,&this->cs_desc_man,"cs_desc_man",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
             ,0xa4d,false);
  new_spks._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &new_spks._M_t._M_impl.super__Rb_tree_header._M_header;
  new_spks._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  new_spks._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  new_spks._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this_01 = &(this->m_wallet_descriptor).cache;
  new_spks._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       new_spks._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  DescriptorCache::operator=(this_01,cache);
  uVar12 = (this->m_wallet_descriptor).range_start;
  p_Var1 = &out_keys.pubkeys._M_t._M_impl.super__Rb_tree_header;
  this_00 = &this->m_map_script_pub_keys;
  do {
    local_194 = uVar12;
    if ((this->m_wallet_descriptor).range_end <= (int)uVar12) {
      pWVar4 = (this->super_ScriptPubKeyMan).m_storage;
      (*pWVar4->_vptr_WalletStorage[0xb])(pWVar4,&new_spks,this);
      std::
      _Rb_tree<CScript,_CScript,_std::_Identity<CScript>,_std::less<CScript>,_std::allocator<CScript>_>
      ::~_Rb_tree(&new_spks._M_t);
      std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock72.super_unique_lock);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
        return;
      }
LAB_00977207:
      __stack_chk_fail();
    }
    out_keys.super_SigningProvider._vptr_SigningProvider =
         (_func_int **)&PTR__FlatSigningProvider_01158e68;
    out_keys.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    out_keys.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    out_keys.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &out_keys.scripts._M_t._M_impl.super__Rb_tree_header._M_header;
    out_keys.scripts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    out_keys.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    out_keys.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    out_keys.pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    out_keys.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    out_keys.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    out_keys.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &out_keys.origins._M_t._M_impl.super__Rb_tree_header._M_header;
    out_keys.origins._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    out_keys.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    out_keys.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    out_keys.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &out_keys.keys._M_t._M_impl.super__Rb_tree_header._M_header;
    out_keys.keys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    out_keys.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    out_keys.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    out_keys.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &out_keys.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header;
    out_keys.tr_trees._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    scripts_temp.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    scripts_temp.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    scripts_temp.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    peVar3 = (this->m_wallet_descriptor).descriptor.
             super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    args_1 = &out_keys;
    out_keys.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         out_keys.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    out_keys.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    out_keys.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    out_keys.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         out_keys.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    out_keys.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         out_keys.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    out_keys.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         out_keys.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    iVar6 = (*peVar3->_vptr_Descriptor[9])(peVar3,(ulong)uVar12,this_01,&scripts_temp);
    if ((char)iVar6 == '\0') {
      prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (prVar11,"Error: Unable to expand wallet descriptor from cache");
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
        __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_00977207;
    }
    std::
    _Rb_tree<CScript,CScript,std::_Identity<CScript>,std::less<CScript>,std::allocator<CScript>>::
    _M_insert_range_unique<__gnu_cxx::__normal_iterator<CScript*,std::vector<CScript,std::allocator<CScript>>>>
              ((_Rb_tree<CScript,CScript,std::_Identity<CScript>,std::less<CScript>,std::allocator<CScript>>
                *)&new_spks,
               (__normal_iterator<CScript_*,_std::vector<CScript,_std::allocator<CScript>_>_>)
               scripts_temp.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
               super__Vector_impl_data._M_start,
               (__normal_iterator<CScript_*,_std::vector<CScript,_std::allocator<CScript>_>_>)
               scripts_temp.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
               super__Vector_impl_data._M_finish);
    pCVar5 = scripts_temp.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (__x_00 = scripts_temp.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
                  super__Vector_impl_data._M_start;
        p_Var10 = out_keys.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
        __x_00 != pCVar5; __x_00 = __x_00 + 1) {
      sVar7 = std::
              map<CScript,_int,_std::less<CScript>,_std::allocator<std::pair<const_CScript,_int>_>_>
              ::count(this_00,__x_00);
      if (sVar7 != 0) {
        prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
        args = std::
               map<CScript,_int,_std::less<CScript>,_std::allocator<std::pair<const_CScript,_int>_>_>
               ::operator[](this_00,__x_00);
        tinyformat::format<int,int>
                  (&local_180,
                   (tinyformat *)"Error: Already loaded script at index %d as being at index %d",
                   (char *)&local_194,args,(int *)args_1);
        std::runtime_error::runtime_error(prVar11,(string *)&local_180);
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
          __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        goto LAB_00977207;
      }
      puVar8 = (uint *)std::
                       map<CScript,_int,_std::less<CScript>,_std::allocator<std::pair<const_CScript,_int>_>_>
                       ::operator[](this_00,__x_00);
      *puVar8 = uVar12;
    }
    for (; (_Rb_tree_header *)p_Var10 != p_Var1;
        p_Var10 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var10)) {
      __x = (key_type *)((long)&p_Var10[1]._M_left + 4);
      sVar9 = std::
              map<CPubKey,_int,_std::less<CPubKey>,_std::allocator<std::pair<const_CPubKey,_int>_>_>
              ::count(&this->m_map_pubkeys,__x);
      uVar12 = local_194;
      if (sVar9 == 0) {
        puVar8 = (uint *)std::
                         map<CPubKey,_int,_std::less<CPubKey>,_std::allocator<std::pair<const_CPubKey,_int>_>_>
                         ::operator[](&this->m_map_pubkeys,__x);
        *puVar8 = uVar12;
      }
    }
    this->m_max_cached_index = this->m_max_cached_index + 1;
    std::vector<CScript,_std::allocator<CScript>_>::~vector(&scripts_temp);
    FlatSigningProvider::~FlatSigningProvider(&out_keys);
    uVar12 = local_194 + 1;
  } while( true );
}

Assistant:

void DescriptorScriptPubKeyMan::SetCache(const DescriptorCache& cache)
{
    LOCK(cs_desc_man);
    std::set<CScript> new_spks;
    m_wallet_descriptor.cache = cache;
    for (int32_t i = m_wallet_descriptor.range_start; i < m_wallet_descriptor.range_end; ++i) {
        FlatSigningProvider out_keys;
        std::vector<CScript> scripts_temp;
        if (!m_wallet_descriptor.descriptor->ExpandFromCache(i, m_wallet_descriptor.cache, scripts_temp, out_keys)) {
            throw std::runtime_error("Error: Unable to expand wallet descriptor from cache");
        }
        // Add all of the scriptPubKeys to the scriptPubKey set
        new_spks.insert(scripts_temp.begin(), scripts_temp.end());
        for (const CScript& script : scripts_temp) {
            if (m_map_script_pub_keys.count(script) != 0) {
                throw std::runtime_error(strprintf("Error: Already loaded script at index %d as being at index %d", i, m_map_script_pub_keys[script]));
            }
            m_map_script_pub_keys[script] = i;
        }
        for (const auto& pk_pair : out_keys.pubkeys) {
            const CPubKey& pubkey = pk_pair.second;
            if (m_map_pubkeys.count(pubkey) != 0) {
                // We don't need to give an error here.
                // It doesn't matter which of many valid indexes the pubkey has, we just need an index where we can derive it and it's private key
                continue;
            }
            m_map_pubkeys[pubkey] = i;
        }
        m_max_cached_index++;
    }
    // Make sure the wallet knows about our new spks
    m_storage.TopUpCallback(new_spks, this);
}